

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void BamTools::Internal::BamStandardIndex::CheckBufferSize
               (uchar **buffer,uint *bufferLength,uint *requestedBytes)

{
  uint uVar1;
  uchar *puVar2;
  stringstream s;
  
  if (*bufferLength < *requestedBytes) {
    uVar1 = *requestedBytes + 10;
    *bufferLength = uVar1;
    if (*buffer != (uchar *)0x0) {
      operator_delete__(*buffer);
      uVar1 = *bufferLength;
    }
    puVar2 = (uchar *)operator_new__((ulong)uVar1);
    *buffer = puVar2;
  }
  return;
}

Assistant:

void BamStandardIndex::CheckBufferSize(unsigned char*& buffer, unsigned int& bufferLength,
                                       const unsigned int& requestedBytes)
{
    try {
        if (requestedBytes > bufferLength) {
            bufferLength = requestedBytes + 10;
            delete[] buffer;
            buffer = new unsigned char[bufferLength];
        }
    } catch (std::bad_alloc&) {
        std::stringstream s;
        s << "out of memory when allocating " << requestedBytes << " bytes";
        throw BamException("BamStandardIndex::CheckBufferSize", s.str());
    }
}